

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layernorm_x86.cpp
# Opt level: O1

int __thiscall
ncnn::LayerNorm_x86::forward_inplace(LayerNorm_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 (*pauVar7) [16];
  float *pfVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  float *pfVar12;
  uint uVar13;
  float *pfVar14;
  uint uVar15;
  long lVar16;
  float *pfVar17;
  uint uVar18;
  ulong uVar19;
  undefined1 (*pauVar20) [16];
  uint uVar21;
  ulong uVar22;
  float *pfVar23;
  float _mean;
  float fVar24;
  float _a_3;
  __m128 _b_128;
  float _b;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float _a;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar42;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar43;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar44;
  float fVar45;
  
  iVar11 = bottom_top_blob->elempack;
  iVar9 = bottom_top_blob->dims;
  iVar1 = bottom_top_blob->w;
  pp_Var2 = this->_vptr_LayerNorm_x86;
  p_Var3 = pp_Var2[-3];
  pfVar17 = *(float **)(&this->field_0xe0 + (long)p_Var3);
  pfVar14 = *(float **)(&this->field_0x128 + (long)p_Var3);
  if (iVar9 == 1) {
    uVar13 = iVar1 * iVar11;
    pfVar8 = (float *)bottom_top_blob->data;
    pfVar23 = pfVar8;
    if ((int)uVar13 < 4) {
      uVar15 = 0;
      fVar24 = 0.0;
      fVar29 = 0.0;
      fVar30 = 0.0;
      fVar31 = 0.0;
    }
    else {
      uVar15 = uVar13 & 0x7ffffffc;
      fVar24 = 0.0;
      fVar29 = 0.0;
      fVar30 = 0.0;
      fVar31 = 0.0;
      iVar11 = 4;
      do {
        fVar24 = fVar24 + *pfVar23;
        fVar29 = fVar29 + pfVar23[1];
        fVar30 = fVar30 + pfVar23[2];
        fVar31 = fVar31 + pfVar23[3];
        pfVar23 = pfVar23 + 4;
        iVar11 = iVar11 + 4;
      } while (iVar11 <= (int)uVar13);
    }
    fVar32 = 0.0;
    if (uVar13 - uVar15 != 0 && (int)uVar15 <= (int)uVar13) {
      lVar16 = 0;
      do {
        fVar32 = fVar32 + pfVar23[lVar16];
        lVar16 = lVar16 + 1;
      } while (uVar13 - uVar15 != (int)lVar16);
    }
    fVar24 = (fVar31 + fVar29 + fVar30 + fVar24 + fVar32) / (float)(int)uVar13;
    pfVar23 = pfVar8;
    if ((int)uVar13 < 4) {
      uVar15 = 0;
      fVar29 = 0.0;
      fVar30 = 0.0;
      fVar31 = 0.0;
      fVar32 = 0.0;
    }
    else {
      uVar15 = uVar13 & 0x7ffffffc;
      fVar29 = 0.0;
      fVar30 = 0.0;
      fVar31 = 0.0;
      fVar32 = 0.0;
      iVar11 = 4;
      do {
        fVar29 = fVar29 + (*pfVar23 - fVar24) * (*pfVar23 - fVar24);
        fVar30 = fVar30 + (pfVar23[1] - fVar24) * (pfVar23[1] - fVar24);
        fVar31 = fVar31 + (pfVar23[2] - fVar24) * (pfVar23[2] - fVar24);
        fVar32 = fVar32 + (pfVar23[3] - fVar24) * (pfVar23[3] - fVar24);
        pfVar23 = pfVar23 + 4;
        iVar11 = iVar11 + 4;
      } while (iVar11 <= (int)uVar13);
    }
    fVar25 = 0.0;
    if (uVar13 - uVar15 != 0 && (int)uVar15 <= (int)uVar13) {
      lVar16 = 0;
      do {
        fVar25 = fVar25 + (pfVar23[lVar16] - fVar24) * (pfVar23[lVar16] - fVar24);
        lVar16 = lVar16 + 1;
      } while (uVar13 - uVar15 != (int)lVar16);
    }
    fVar32 = fVar32 + fVar30;
    fVar30 = (fVar32 + fVar31 + fVar29 + fVar25) / (float)(int)uVar13 +
             *(float *)(&this->field_0xd4 + (long)p_Var3);
    auVar35._4_4_ = fVar32;
    auVar35._0_4_ = fVar30;
    auVar35._8_4_ = fVar32;
    auVar35._12_4_ = fVar32;
    auVar35 = rsqrtss(ZEXT816(0),auVar35);
    fVar29 = auVar35._0_4_;
    fVar29 = fVar29 * -0.5 * (fVar30 * fVar29 * fVar29 + -3.0);
    fVar24 = -fVar24 * fVar29;
    if (*(int *)(&this->field_0xd8 + (long)p_Var3) == 0) {
      uVar15 = 0;
      if (3 < (int)uVar13) {
        uVar15 = uVar13 & 0x7ffffffc;
        iVar11 = 4;
        do {
          *pfVar8 = *pfVar8 * fVar29 + fVar24;
          pfVar8[1] = pfVar8[1] * fVar29 + fVar24;
          pfVar8[2] = pfVar8[2] * fVar29 + fVar24;
          pfVar8[3] = pfVar8[3] * fVar29 + fVar24;
          pfVar8 = pfVar8 + 4;
          iVar11 = iVar11 + 4;
        } while (iVar11 <= (int)uVar13);
      }
      if (uVar13 - uVar15 != 0 && (int)uVar15 <= (int)uVar13) {
        lVar16 = 0;
        do {
          pfVar8[lVar16] = pfVar8[lVar16] * fVar29 + fVar24;
          lVar16 = lVar16 + 1;
        } while (uVar13 - uVar15 != (int)lVar16);
      }
    }
    else {
      uVar15 = 0;
      if (3 < (int)uVar13) {
        uVar15 = uVar13 & 0x7ffffffc;
        iVar11 = 4;
        do {
          fVar30 = pfVar17[1];
          fVar31 = pfVar17[2];
          fVar32 = pfVar17[3];
          fVar25 = pfVar14[1];
          fVar27 = pfVar14[2];
          fVar28 = pfVar14[3];
          *pfVar8 = (*pfVar8 * fVar29 + fVar24) * *pfVar17 + *pfVar14;
          pfVar8[1] = (pfVar8[1] * fVar29 + fVar24) * fVar30 + fVar25;
          pfVar8[2] = (pfVar8[2] * fVar29 + fVar24) * fVar31 + fVar27;
          pfVar8[3] = (pfVar8[3] * fVar29 + fVar24) * fVar32 + fVar28;
          pfVar8 = pfVar8 + 4;
          pfVar17 = pfVar17 + 4;
          pfVar14 = pfVar14 + 4;
          iVar11 = iVar11 + 4;
        } while (iVar11 <= (int)uVar13);
      }
      if (uVar13 - uVar15 != 0 && (int)uVar15 <= (int)uVar13) {
        lVar16 = 0;
        do {
          pfVar8[lVar16] = (pfVar8[lVar16] * fVar29 + fVar24) * pfVar17[lVar16] + pfVar14[lVar16];
          lVar16 = lVar16 + 1;
        } while (uVar13 - uVar15 != (int)lVar16);
      }
    }
  }
  else {
    uVar13 = bottom_top_blob->h;
    uVar15 = bottom_top_blob->c;
    if (iVar9 == 3) {
      if (*(int *)(&this->field_0xd0 + (long)pp_Var2[-3]) == iVar1) {
        if (0 < (int)uVar15) {
          pp_Var2 = this->_vptr_LayerNorm_x86;
          uVar18 = iVar1 * iVar11;
          fVar24 = 1.0 / (float)iVar1;
          uVar21 = uVar18 & 0xfffffffc;
          uVar19 = 0;
          do {
            if (0 < (int)uVar13) {
              uVar22 = 0;
              do {
                pauVar20 = (undefined1 (*) [16])
                           ((long)bottom_top_blob->data +
                           (long)bottom_top_blob->w * uVar22 * bottom_top_blob->elemsize +
                           bottom_top_blob->cstep * uVar19 * bottom_top_blob->elemsize);
                pauVar7 = pauVar20;
                if ((int)uVar18 < 4) {
                  fVar29 = 0.0;
                  fVar30 = 0.0;
                  fVar31 = 0.0;
                  fVar32 = 0.0;
                  uVar10 = 0;
                }
                else {
                  fVar29 = 0.0;
                  fVar30 = 0.0;
                  fVar31 = 0.0;
                  fVar32 = 0.0;
                  iVar9 = 4;
                  do {
                    fVar29 = fVar29 + *(float *)*pauVar7;
                    fVar30 = fVar30 + *(float *)(*pauVar7 + 4);
                    fVar31 = fVar31 + *(float *)(*pauVar7 + 8);
                    fVar32 = fVar32 + *(float *)(*pauVar7 + 0xc);
                    pauVar7 = pauVar7 + 1;
                    iVar9 = iVar9 + 4;
                    uVar10 = uVar21;
                  } while (iVar9 <= (int)uVar18);
                }
                fVar25 = 0.0;
                if (uVar18 - uVar10 != 0 && (int)uVar10 <= (int)uVar18) {
                  lVar16 = 0;
                  do {
                    fVar25 = fVar25 + *(float *)(*pauVar7 + lVar16 * 4);
                    lVar16 = lVar16 + 1;
                  } while (uVar18 - uVar10 != (int)lVar16);
                }
                if (iVar11 == 1) {
                  fVar26 = (fVar32 + fVar30 + fVar31 + fVar29 + fVar25) * fVar24;
                  fVar25 = 0.0;
                  fVar27 = 0.0;
                  fVar28 = 0.0;
                }
                else {
                  fVar26 = 0.0;
                  fVar25 = 0.0;
                  fVar27 = 0.0;
                  fVar28 = 0.0;
                  if (iVar11 == 4) {
                    fVar26 = fVar29 * fVar24;
                    fVar25 = fVar30 * fVar24;
                    fVar27 = fVar31 * fVar24;
                    fVar28 = fVar32 * fVar24;
                  }
                }
                fVar29 = fVar25;
                fVar30 = fVar27;
                fVar31 = fVar28;
                if (iVar11 != 4) {
                  fVar29 = fVar26;
                  fVar30 = fVar26;
                  fVar31 = fVar26;
                }
                pauVar7 = pauVar20;
                if ((int)uVar18 < 4) {
                  auVar38 = ZEXT816(0);
                  uVar10 = 0;
                }
                else {
                  iVar9 = 4;
                  auVar35 = ZEXT816(0);
                  do {
                    fVar32 = *(float *)*pauVar7 - fVar26;
                    fVar33 = *(float *)(*pauVar7 + 4) - fVar29;
                    fVar45 = *(float *)(*pauVar7 + 8) - fVar30;
                    fVar44 = *(float *)(*pauVar7 + 0xc) - fVar31;
                    auVar38._0_4_ = auVar35._0_4_ + fVar32 * fVar32;
                    auVar38._4_4_ = auVar35._4_4_ + fVar33 * fVar33;
                    auVar38._8_4_ = auVar35._8_4_ + fVar45 * fVar45;
                    auVar38._12_4_ = auVar35._12_4_ + fVar44 * fVar44;
                    pauVar7 = pauVar7 + 1;
                    iVar9 = iVar9 + 4;
                    auVar35 = auVar38;
                    uVar10 = uVar21;
                  } while (iVar9 <= (int)uVar18);
                }
                fVar29 = 0.0;
                if (uVar18 - uVar10 != 0 && (int)uVar10 <= (int)uVar18) {
                  lVar16 = 0;
                  do {
                    fVar30 = *(float *)(*pauVar7 + lVar16 * 4) - fVar26;
                    fVar29 = fVar29 + fVar30 * fVar30;
                    lVar16 = lVar16 + 1;
                  } while (uVar18 - uVar10 != (int)lVar16);
                }
                fVar30 = 0.0;
                fVar31 = 0.0;
                fVar32 = 0.0;
                fVar33 = 0.0;
                if (iVar11 == 4) {
                  fVar30 = auVar38._0_4_ * fVar24;
                  fVar31 = auVar38._4_4_ * fVar24;
                  fVar32 = auVar38._8_4_ * fVar24;
                  fVar33 = auVar38._12_4_ * fVar24;
                }
                fVar45 = *(float *)(&this->field_0xd4 + (long)pp_Var2[-3]);
                if (iVar11 == 1) {
                  fVar45 = fVar45 + (auVar38._12_4_ + auVar38._4_4_ + auVar38._8_4_ + auVar38._0_4_
                                    + fVar29) * fVar24;
                  auVar35 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar45));
                  fVar29 = auVar35._0_4_;
                  fVar30 = fVar29 * -0.5 * (fVar45 * fVar29 * fVar29 + -3.0);
                  fVar26 = -fVar26 * fVar30;
                }
                else if (iVar11 == 4) {
                  auVar5._4_4_ = fVar31 + fVar45;
                  auVar5._0_4_ = fVar30 + fVar45;
                  auVar5._8_4_ = fVar32 + fVar45;
                  auVar5._12_4_ = fVar33 + fVar45;
                  auVar35 = rsqrtps(auVar38,auVar5);
                  fVar29 = auVar35._0_4_;
                  fVar44 = auVar35._4_4_;
                  fVar42 = auVar35._8_4_;
                  fVar43 = auVar35._12_4_;
                  fVar30 = ((fVar30 + fVar45) * fVar29 * fVar29 + -3.0) * fVar29 * -0.5;
                  fVar31 = ((fVar31 + fVar45) * fVar44 * fVar44 + -3.0) * fVar44 * -0.5;
                  fVar32 = ((fVar32 + fVar45) * fVar42 * fVar42 + -3.0) * fVar42 * -0.5;
                  fVar33 = ((fVar33 + fVar45) * fVar43 * fVar43 + -3.0) * fVar43 * -0.5;
                  fVar26 = -fVar26 * fVar30;
                  fVar25 = -fVar25 * fVar31;
                  fVar27 = -fVar27 * fVar32;
                  fVar28 = -fVar28 * fVar33;
                }
                if (*(int *)(&this->field_0xd8 + (long)pp_Var2[-3]) == 0) {
                  auVar39._4_4_ = fVar31;
                  auVar39._0_4_ = fVar30;
                  auVar39._8_4_ = fVar32;
                  auVar39._12_4_ = fVar33;
                  if (iVar11 != 4) {
                    auVar39._4_4_ = fVar30;
                    auVar39._8_4_ = fVar30;
                    auVar39._12_4_ = fVar30;
                    fVar25 = fVar26;
                    fVar27 = fVar26;
                    fVar28 = fVar26;
                  }
                  uVar10 = 0;
                  if (3 < (int)uVar18) {
                    iVar9 = 4;
                    do {
                      fVar29 = *(float *)(*pauVar20 + 4);
                      fVar31 = *(float *)(*pauVar20 + 8);
                      fVar32 = *(float *)(*pauVar20 + 0xc);
                      *(float *)*pauVar20 = *(float *)*pauVar20 * auVar39._0_4_ + fVar26;
                      *(float *)(*pauVar20 + 4) = fVar29 * auVar39._4_4_ + fVar25;
                      *(float *)(*pauVar20 + 8) = fVar31 * auVar39._8_4_ + fVar27;
                      *(float *)(*pauVar20 + 0xc) = fVar32 * auVar39._12_4_ + fVar28;
                      pauVar20 = pauVar20 + 1;
                      iVar9 = iVar9 + 4;
                      uVar10 = uVar21;
                    } while (iVar9 <= (int)uVar18);
                  }
                  if (uVar18 - uVar10 != 0 && (int)uVar10 <= (int)uVar18) {
                    lVar16 = 0;
                    do {
                      *(float *)(*pauVar20 + lVar16 * 4) =
                           *(float *)(*pauVar20 + lVar16 * 4) * fVar30 + fVar26;
                      lVar16 = lVar16 + 1;
                    } while (uVar18 - uVar10 != (int)lVar16);
                  }
                }
                else {
                  pfVar8 = pfVar14;
                  pfVar23 = pfVar17;
                  if (3 < (int)uVar18 && iVar11 == 4) {
                    iVar9 = 4;
                    do {
                      fVar29 = *pfVar23;
                      fVar45 = *pfVar8;
                      auVar40._0_4_ = (*(float *)*pauVar20 * fVar30 + fVar26) * fVar29 + fVar45;
                      auVar40._4_4_ =
                           (*(float *)(*pauVar20 + 4) * fVar31 + fVar25) * fVar29 + fVar45;
                      auVar40._8_4_ =
                           (*(float *)(*pauVar20 + 8) * fVar32 + fVar27) * fVar29 + fVar45;
                      auVar40._12_4_ =
                           (*(float *)(*pauVar20 + 0xc) * fVar33 + fVar28) * fVar29 + fVar45;
                      *pauVar20 = auVar40;
                      pauVar20 = pauVar20 + 1;
                      pfVar23 = pfVar23 + 1;
                      pfVar8 = pfVar8 + 1;
                      iVar9 = iVar9 + 4;
                    } while (iVar9 <= (int)uVar18);
                  }
                  if (iVar11 == 1) {
                    uVar10 = 0;
                    if (3 < (int)uVar18) {
                      iVar9 = 4;
                      do {
                        fVar29 = *(float *)(*pauVar20 + 4);
                        fVar31 = *(float *)(*pauVar20 + 8);
                        fVar32 = *(float *)(*pauVar20 + 0xc);
                        fVar25 = pfVar23[1];
                        fVar27 = pfVar23[2];
                        fVar28 = pfVar23[3];
                        fVar33 = pfVar8[1];
                        fVar45 = pfVar8[2];
                        fVar44 = pfVar8[3];
                        *(float *)*pauVar20 =
                             *pfVar8 + *pfVar23 * (*(float *)*pauVar20 * fVar30 + fVar26);
                        *(float *)(*pauVar20 + 4) = fVar33 + fVar25 * (fVar29 * fVar30 + fVar26);
                        *(float *)(*pauVar20 + 8) = fVar45 + fVar27 * (fVar31 * fVar30 + fVar26);
                        *(float *)(*pauVar20 + 0xc) = fVar44 + fVar28 * (fVar32 * fVar30 + fVar26);
                        pauVar20 = pauVar20 + 1;
                        pfVar23 = pfVar23 + 4;
                        pfVar8 = pfVar8 + 4;
                        iVar9 = iVar9 + 4;
                        uVar10 = uVar21;
                      } while (iVar9 <= (int)uVar18);
                    }
                    if (uVar18 - uVar10 != 0 && (int)uVar10 <= (int)uVar18) {
                      lVar16 = 0;
                      do {
                        *(float *)(*pauVar20 + lVar16 * 4) =
                             (*(float *)(*pauVar20 + lVar16 * 4) * fVar30 + fVar26) *
                             pfVar23[lVar16] + pfVar8[lVar16];
                        lVar16 = lVar16 + 1;
                      } while (uVar18 - uVar10 != (int)lVar16);
                    }
                  }
                }
                uVar22 = uVar22 + 1;
              } while (uVar22 != uVar13);
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 != uVar15);
        }
      }
      else if (0 < (int)uVar15) {
        pp_Var2 = this->_vptr_LayerNorm_x86;
        uVar21 = uVar13 * iVar1 * iVar11;
        fVar24 = 1.0 / (float)(int)(uVar13 * iVar1);
        uVar13 = uVar21 & 0xfffffffc;
        uVar19 = 0;
        do {
          pfVar23 = (float *)(bottom_top_blob->cstep * uVar19 * bottom_top_blob->elemsize +
                             (long)bottom_top_blob->data);
          fVar29 = 0.0;
          fVar30 = 0.0;
          fVar31 = 0.0;
          fVar32 = 0.0;
          pfVar8 = pfVar23;
          uVar18 = 0;
          if (3 < (int)uVar21) {
            iVar9 = 4;
            do {
              fVar29 = fVar29 + *pfVar8;
              fVar30 = fVar30 + pfVar8[1];
              fVar31 = fVar31 + pfVar8[2];
              fVar32 = fVar32 + pfVar8[3];
              pfVar8 = pfVar8 + 4;
              iVar9 = iVar9 + 4;
              uVar18 = uVar13;
            } while (iVar9 <= (int)uVar21);
          }
          fVar25 = 0.0;
          if (uVar21 - uVar18 != 0 && (int)uVar18 <= (int)uVar21) {
            lVar16 = 0;
            do {
              fVar25 = fVar25 + pfVar8[lVar16];
              lVar16 = lVar16 + 1;
            } while (uVar21 - uVar18 != (int)lVar16);
          }
          if (iVar11 == 1) {
            fVar26 = (fVar32 + fVar30 + fVar31 + fVar29 + fVar25) * fVar24;
            fVar25 = 0.0;
            fVar27 = 0.0;
            fVar28 = 0.0;
          }
          else {
            fVar26 = 0.0;
            fVar25 = 0.0;
            fVar27 = 0.0;
            fVar28 = 0.0;
            if (iVar11 == 4) {
              fVar26 = fVar29 * fVar24;
              fVar25 = fVar30 * fVar24;
              fVar27 = fVar31 * fVar24;
              fVar28 = fVar32 * fVar24;
            }
          }
          fVar29 = fVar25;
          fVar30 = fVar27;
          fVar31 = fVar28;
          if (iVar11 != 4) {
            fVar29 = fVar26;
            fVar30 = fVar26;
            fVar31 = fVar26;
          }
          pfVar8 = pfVar23;
          if ((int)uVar21 < 4) {
            auVar41 = ZEXT816(0);
            uVar18 = 0;
          }
          else {
            iVar9 = 4;
            auVar35 = ZEXT816(0);
            do {
              auVar41._0_4_ = auVar35._0_4_ + (*pfVar8 - fVar26) * (*pfVar8 - fVar26);
              auVar41._4_4_ = auVar35._4_4_ + (pfVar8[1] - fVar29) * (pfVar8[1] - fVar29);
              auVar41._8_4_ = auVar35._8_4_ + (pfVar8[2] - fVar30) * (pfVar8[2] - fVar30);
              auVar41._12_4_ = auVar35._12_4_ + (pfVar8[3] - fVar31) * (pfVar8[3] - fVar31);
              pfVar8 = pfVar8 + 4;
              iVar9 = iVar9 + 4;
              auVar35 = auVar41;
              uVar18 = uVar13;
            } while (iVar9 <= (int)uVar21);
          }
          fVar29 = 0.0;
          if (uVar21 - uVar18 != 0 && (int)uVar18 <= (int)uVar21) {
            lVar16 = 0;
            do {
              fVar29 = fVar29 + (pfVar8[lVar16] - fVar26) * (pfVar8[lVar16] - fVar26);
              lVar16 = lVar16 + 1;
            } while (uVar21 - uVar18 != (int)lVar16);
          }
          fVar33 = 0.0;
          fVar32 = 0.0;
          fVar31 = 0.0;
          fVar30 = 0.0;
          if (iVar11 == 4) {
            fVar33 = auVar41._0_4_ * fVar24;
            fVar32 = auVar41._4_4_ * fVar24;
            fVar31 = auVar41._8_4_ * fVar24;
            fVar30 = auVar41._12_4_ * fVar24;
          }
          fVar45 = *(float *)(&this->field_0xd4 + (long)pp_Var2[-3]);
          if (iVar11 == 1) {
            fVar45 = fVar45 + (auVar41._12_4_ + auVar41._4_4_ + auVar41._8_4_ + auVar41._0_4_ +
                              fVar29) * fVar24;
            auVar35 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar45));
            fVar29 = auVar35._0_4_;
            fVar33 = fVar29 * -0.5 * (fVar45 * fVar29 * fVar29 + -3.0);
            fVar26 = -fVar26 * fVar33;
          }
          else if (iVar11 == 4) {
            auVar6._4_4_ = fVar32 + fVar45;
            auVar6._0_4_ = fVar33 + fVar45;
            auVar6._8_4_ = fVar31 + fVar45;
            auVar6._12_4_ = fVar30 + fVar45;
            auVar35 = rsqrtps(auVar41,auVar6);
            fVar29 = auVar35._0_4_;
            fVar44 = auVar35._4_4_;
            fVar42 = auVar35._8_4_;
            fVar43 = auVar35._12_4_;
            fVar33 = ((fVar33 + fVar45) * fVar29 * fVar29 + -3.0) * fVar29 * -0.5;
            fVar32 = ((fVar32 + fVar45) * fVar44 * fVar44 + -3.0) * fVar44 * -0.5;
            fVar31 = ((fVar31 + fVar45) * fVar42 * fVar42 + -3.0) * fVar42 * -0.5;
            fVar30 = ((fVar30 + fVar45) * fVar43 * fVar43 + -3.0) * fVar43 * -0.5;
            fVar26 = -fVar26 * fVar33;
            fVar25 = -fVar25 * fVar32;
            fVar27 = -fVar27 * fVar31;
            fVar28 = -fVar28 * fVar30;
          }
          if (*(int *)(&this->field_0xd8 + (long)pp_Var2[-3]) == 0) {
            if (iVar11 != 4) {
              fVar25 = fVar26;
              fVar27 = fVar26;
              fVar28 = fVar26;
              fVar30 = fVar33;
              fVar31 = fVar33;
              fVar32 = fVar33;
            }
            uVar18 = 0;
            if (3 < (int)uVar21) {
              iVar9 = 4;
              do {
                *pfVar23 = *pfVar23 * fVar33 + fVar26;
                pfVar23[1] = pfVar23[1] * fVar32 + fVar25;
                pfVar23[2] = pfVar23[2] * fVar31 + fVar27;
                pfVar23[3] = pfVar23[3] * fVar30 + fVar28;
                pfVar23 = pfVar23 + 4;
                iVar9 = iVar9 + 4;
                uVar18 = uVar13;
              } while (iVar9 <= (int)uVar21);
            }
            if (uVar21 - uVar18 != 0 && (int)uVar18 <= (int)uVar21) {
              lVar16 = 0;
              do {
                pfVar23[lVar16] = pfVar23[lVar16] * fVar33 + fVar26;
                lVar16 = lVar16 + 1;
              } while (uVar21 - uVar18 != (int)lVar16);
            }
          }
          else {
            pfVar8 = pfVar14;
            pfVar12 = pfVar17;
            if (3 < (int)uVar21 && iVar11 == 4) {
              iVar9 = 4;
              do {
                fVar29 = *pfVar12;
                fVar45 = *pfVar8;
                *pfVar23 = (*pfVar23 * fVar33 + fVar26) * fVar29 + fVar45;
                pfVar23[1] = (pfVar23[1] * fVar32 + fVar25) * fVar29 + fVar45;
                pfVar23[2] = (pfVar23[2] * fVar31 + fVar27) * fVar29 + fVar45;
                pfVar23[3] = (pfVar23[3] * fVar30 + fVar28) * fVar29 + fVar45;
                pfVar23 = pfVar23 + 4;
                pfVar12 = pfVar12 + 1;
                pfVar8 = pfVar8 + 1;
                iVar9 = iVar9 + 4;
              } while (iVar9 <= (int)uVar21);
            }
            if (iVar11 == 1) {
              uVar18 = 0;
              if (3 < (int)uVar21) {
                iVar9 = 4;
                do {
                  fVar29 = pfVar12[1];
                  fVar30 = pfVar12[2];
                  fVar31 = pfVar12[3];
                  fVar32 = pfVar8[1];
                  fVar25 = pfVar8[2];
                  fVar27 = pfVar8[3];
                  *pfVar23 = *pfVar8 + *pfVar12 * (*pfVar23 * fVar33 + fVar26);
                  pfVar23[1] = fVar32 + fVar29 * (pfVar23[1] * fVar33 + fVar26);
                  pfVar23[2] = fVar25 + fVar30 * (pfVar23[2] * fVar33 + fVar26);
                  pfVar23[3] = fVar27 + fVar31 * (pfVar23[3] * fVar33 + fVar26);
                  pfVar23 = pfVar23 + 4;
                  pfVar12 = pfVar12 + 4;
                  pfVar8 = pfVar8 + 4;
                  iVar9 = iVar9 + 4;
                  uVar18 = uVar13;
                } while (iVar9 <= (int)uVar21);
              }
              if (uVar21 - uVar18 != 0 && (int)uVar18 <= (int)uVar21) {
                lVar16 = 0;
                do {
                  pfVar23[lVar16] =
                       (pfVar23[lVar16] * fVar33 + fVar26) * pfVar12[lVar16] + pfVar8[lVar16];
                  lVar16 = lVar16 + 1;
                } while (uVar21 - uVar18 != (int)lVar16);
              }
            }
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 != uVar15);
      }
    }
    else if ((iVar9 == 2) && (0 < (int)uVar13)) {
      uVar15 = iVar1 * iVar11;
      fVar24 = 1.0 / (float)iVar1;
      uVar21 = uVar15 & 0xfffffffc;
      uVar19 = 0;
      do {
        pauVar20 = (undefined1 (*) [16])
                   ((long)bottom_top_blob->w * uVar19 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        fVar29 = 0.0;
        fVar30 = 0.0;
        fVar31 = 0.0;
        fVar32 = 0.0;
        pauVar7 = pauVar20;
        uVar18 = 0;
        if (3 < (int)uVar15) {
          iVar9 = 4;
          do {
            fVar29 = fVar29 + *(float *)*pauVar7;
            fVar30 = fVar30 + *(float *)((long)*pauVar7 + 4);
            fVar31 = fVar31 + *(float *)((long)*pauVar7 + 8);
            fVar32 = fVar32 + *(float *)((long)*pauVar7 + 0xc);
            pauVar7 = pauVar7 + 1;
            iVar9 = iVar9 + 4;
            uVar18 = uVar21;
          } while (iVar9 <= (int)uVar15);
        }
        fVar25 = 0.0;
        if (uVar15 - uVar18 != 0 && (int)uVar18 <= (int)uVar15) {
          lVar16 = 0;
          do {
            fVar25 = fVar25 + *(float *)((long)*pauVar7 + lVar16 * 4);
            lVar16 = lVar16 + 1;
          } while (uVar15 - uVar18 != (int)lVar16);
        }
        if (iVar11 == 1) {
          fVar26 = (fVar32 + fVar30 + fVar31 + fVar29 + fVar25) * fVar24;
          fVar25 = 0.0;
          fVar27 = 0.0;
          fVar28 = 0.0;
        }
        else {
          fVar26 = 0.0;
          fVar25 = 0.0;
          fVar27 = 0.0;
          fVar28 = 0.0;
          if (iVar11 == 4) {
            fVar26 = fVar29 * fVar24;
            fVar25 = fVar30 * fVar24;
            fVar27 = fVar31 * fVar24;
            fVar28 = fVar32 * fVar24;
          }
        }
        fVar29 = fVar25;
        fVar30 = fVar27;
        fVar31 = fVar28;
        if (iVar11 != 4) {
          fVar29 = fVar26;
          fVar30 = fVar26;
          fVar31 = fVar26;
        }
        pauVar7 = pauVar20;
        if ((int)uVar15 < 4) {
          auVar34 = ZEXT816(0);
          uVar18 = 0;
        }
        else {
          iVar9 = 4;
          auVar35 = ZEXT816(0);
          do {
            fVar32 = *(float *)*pauVar7 - fVar26;
            fVar33 = *(float *)((long)*pauVar7 + 4) - fVar29;
            fVar45 = *(float *)((long)*pauVar7 + 8) - fVar30;
            fVar44 = *(float *)((long)*pauVar7 + 0xc) - fVar31;
            auVar34._0_4_ = auVar35._0_4_ + fVar32 * fVar32;
            auVar34._4_4_ = auVar35._4_4_ + fVar33 * fVar33;
            auVar34._8_4_ = auVar35._8_4_ + fVar45 * fVar45;
            auVar34._12_4_ = auVar35._12_4_ + fVar44 * fVar44;
            pauVar7 = pauVar7 + 1;
            iVar9 = iVar9 + 4;
            auVar35 = auVar34;
            uVar18 = uVar21;
          } while (iVar9 <= (int)uVar15);
        }
        fVar29 = 0.0;
        if (uVar15 - uVar18 != 0 && (int)uVar18 <= (int)uVar15) {
          lVar16 = 0;
          do {
            fVar30 = *(float *)((long)*pauVar7 + lVar16 * 4) - fVar26;
            fVar29 = fVar29 + fVar30 * fVar30;
            lVar16 = lVar16 + 1;
          } while (uVar15 - uVar18 != (int)lVar16);
        }
        fVar30 = 0.0;
        fVar31 = 0.0;
        fVar32 = 0.0;
        fVar33 = 0.0;
        if (iVar11 == 4) {
          fVar30 = auVar34._0_4_ * fVar24;
          fVar31 = auVar34._4_4_ * fVar24;
          fVar32 = auVar34._8_4_ * fVar24;
          fVar33 = auVar34._12_4_ * fVar24;
        }
        fVar45 = *(float *)(&this->field_0xd4 + (long)pp_Var2[-3]);
        if (iVar11 == 1) {
          fVar45 = fVar45 + (auVar34._12_4_ + auVar34._4_4_ + auVar34._8_4_ + auVar34._0_4_ + fVar29
                            ) * fVar24;
          auVar35 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar45));
          fVar29 = auVar35._0_4_;
          fVar30 = fVar29 * -0.5 * (fVar45 * fVar29 * fVar29 + -3.0);
          fVar26 = -fVar26 * fVar30;
        }
        else if (iVar11 == 4) {
          auVar4._4_4_ = fVar31 + fVar45;
          auVar4._0_4_ = fVar30 + fVar45;
          auVar4._8_4_ = fVar32 + fVar45;
          auVar4._12_4_ = fVar33 + fVar45;
          auVar35 = rsqrtps(auVar34,auVar4);
          fVar29 = auVar35._0_4_;
          fVar44 = auVar35._4_4_;
          fVar42 = auVar35._8_4_;
          fVar43 = auVar35._12_4_;
          fVar30 = ((fVar30 + fVar45) * fVar29 * fVar29 + -3.0) * fVar29 * -0.5;
          fVar31 = ((fVar31 + fVar45) * fVar44 * fVar44 + -3.0) * fVar44 * -0.5;
          fVar32 = ((fVar32 + fVar45) * fVar42 * fVar42 + -3.0) * fVar42 * -0.5;
          fVar33 = ((fVar33 + fVar45) * fVar43 * fVar43 + -3.0) * fVar43 * -0.5;
          fVar26 = -fVar26 * fVar30;
          fVar25 = -fVar25 * fVar31;
          fVar27 = -fVar27 * fVar32;
          fVar28 = -fVar28 * fVar33;
        }
        if (*(int *)(&this->field_0xd8 + (long)pp_Var2[-3]) == 0) {
          auVar36._4_4_ = fVar31;
          auVar36._0_4_ = fVar30;
          auVar36._8_4_ = fVar32;
          auVar36._12_4_ = fVar33;
          if (iVar11 != 4) {
            auVar36._4_4_ = fVar30;
            auVar36._8_4_ = fVar30;
            auVar36._12_4_ = fVar30;
            fVar25 = fVar26;
            fVar27 = fVar26;
            fVar28 = fVar26;
          }
          uVar18 = 0;
          if (3 < (int)uVar15) {
            iVar9 = 4;
            do {
              fVar29 = *(float *)((long)*pauVar20 + 4);
              fVar31 = *(float *)((long)*pauVar20 + 8);
              fVar32 = *(float *)((long)*pauVar20 + 0xc);
              *(float *)*pauVar20 = *(float *)*pauVar20 * auVar36._0_4_ + fVar26;
              *(float *)((long)*pauVar20 + 4) = fVar29 * auVar36._4_4_ + fVar25;
              *(float *)((long)*pauVar20 + 8) = fVar31 * auVar36._8_4_ + fVar27;
              *(float *)((long)*pauVar20 + 0xc) = fVar32 * auVar36._12_4_ + fVar28;
              pauVar20 = pauVar20 + 1;
              iVar9 = iVar9 + 4;
              uVar18 = uVar21;
            } while (iVar9 <= (int)uVar15);
          }
          if (uVar15 - uVar18 != 0 && (int)uVar18 <= (int)uVar15) {
            lVar16 = 0;
            do {
              *(float *)((long)*pauVar20 + lVar16 * 4) =
                   *(float *)((long)*pauVar20 + lVar16 * 4) * fVar30 + fVar26;
              lVar16 = lVar16 + 1;
            } while (uVar15 - uVar18 != (int)lVar16);
          }
        }
        else {
          pfVar8 = pfVar17;
          pfVar23 = pfVar14;
          if (3 < (int)uVar15 && iVar11 == 4) {
            iVar9 = 4;
            do {
              fVar29 = *pfVar8;
              fVar45 = *pfVar23;
              auVar37._0_4_ = (*(float *)*pauVar20 * fVar30 + fVar26) * fVar29 + fVar45;
              auVar37._4_4_ = (*(float *)((long)*pauVar20 + 4) * fVar31 + fVar25) * fVar29 + fVar45;
              auVar37._8_4_ = (*(float *)((long)*pauVar20 + 8) * fVar32 + fVar27) * fVar29 + fVar45;
              auVar37._12_4_ =
                   (*(float *)((long)*pauVar20 + 0xc) * fVar33 + fVar28) * fVar29 + fVar45;
              *pauVar20 = auVar37;
              pauVar20 = pauVar20 + 1;
              pfVar8 = pfVar8 + 1;
              pfVar23 = pfVar23 + 1;
              iVar9 = iVar9 + 4;
            } while (iVar9 <= (int)uVar15);
          }
          if (iVar11 == 1) {
            uVar18 = 0;
            if (3 < (int)uVar15) {
              iVar9 = 4;
              do {
                fVar29 = *(float *)((long)*pauVar20 + 4);
                fVar31 = *(float *)((long)*pauVar20 + 8);
                fVar32 = *(float *)((long)*pauVar20 + 0xc);
                fVar25 = pfVar8[1];
                fVar27 = pfVar8[2];
                fVar28 = pfVar8[3];
                fVar33 = pfVar23[1];
                fVar45 = pfVar23[2];
                fVar44 = pfVar23[3];
                *(float *)*pauVar20 = *pfVar23 + *pfVar8 * (*(float *)*pauVar20 * fVar30 + fVar26);
                *(float *)((long)*pauVar20 + 4) = fVar33 + fVar25 * (fVar29 * fVar30 + fVar26);
                *(float *)((long)*pauVar20 + 8) = fVar45 + fVar27 * (fVar31 * fVar30 + fVar26);
                *(float *)((long)*pauVar20 + 0xc) = fVar44 + fVar28 * (fVar32 * fVar30 + fVar26);
                pauVar20 = pauVar20 + 1;
                pfVar8 = pfVar8 + 4;
                pfVar23 = pfVar23 + 4;
                iVar9 = iVar9 + 4;
                uVar18 = uVar21;
              } while (iVar9 <= (int)uVar15);
            }
            if (uVar15 - uVar18 != 0 && (int)uVar18 <= (int)uVar15) {
              lVar16 = 0;
              do {
                *(float *)((long)*pauVar20 + lVar16 * 4) =
                     (*(float *)((long)*pauVar20 + lVar16 * 4) * fVar30 + fVar26) * pfVar8[lVar16] +
                     pfVar23[lVar16];
                lVar16 = lVar16 + 1;
              } while (uVar15 - uVar18 != (int)lVar16);
            }
          }
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 != uVar13);
    }
  }
  return 0;
}

Assistant:

int LayerNorm_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int elempack = bottom_top_blob.elempack;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;

    const float* gamma = gamma_data;
    const float* beta = beta_data;

    if (dims == 1)
    {
        int elemcount = w * elempack;
        float* ptr = bottom_top_blob;
        // 1D layer norm is special. Treat them as unpacked.
        fast_1d_layer_norm(ptr, 1, elemcount, elemcount, gamma, beta, affine, eps);
    }

    if (dims == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; ++i)
        {
            float* ptr = bottom_top_blob.row(i);
            fast_1d_layer_norm(ptr, elempack, w, w * elempack, gamma, beta, affine, eps);
        }
    }

    if (dims == 3)
    {
        if (affine_size == w)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; ++q)
            {
                for (int i = 0; i < h; ++i)
                {
                    float* ptr = bottom_top_blob.channel(q).row(i);
                    fast_1d_layer_norm(ptr, elempack, w, w * elempack, gamma, beta, affine, eps);
                }
            }
        }
        else // if (affine_size == w * h)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; ++q)
            {
                float* ptr = bottom_top_blob.channel(q);
                fast_1d_layer_norm(ptr, elempack, w * h, w * h * elempack, gamma, beta, affine, eps);
            }
        }
    }

    return 0;
}